

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this;
  PointerGraph *pPVar2;
  _Head_base<0UL,_llvm::Module_*,_false> m;
  long lVar3;
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> this_00;
  _func_int **pp_Var4;
  raw_ostream *prVar5;
  size_t sVar6;
  int iVar7;
  char *pcVar8;
  StringRef SVar9;
  StringRef Str;
  StringRef Str_00;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  CallGraph CG;
  LLVMContext context;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  _Head_base<0UL,_llvm::Module_*,_false> local_3b8;
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> local_3b0;
  undefined1 local_3a8 [8];
  DGLLVMPointerAnalysis local_3a0;
  LLVMPointerAnalysisOptions local_310;
  SlicerOptions local_2a0;
  
  setupStackTraceOnError(argc,argv);
  iVar7 = 1;
  parseSlicerOptions((int)&local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_3a8);
  parseModule((char *)&local_3b8,(LLVMContext *)"llvm-cg-dump",(SlicerOptions *)local_3a8);
  if (local_3b8._M_head_impl == (Module *)0x0) goto LAB_00110ad4;
  SVar9.Length = (size_t)local_2a0.dgOptions.entryFunction._M_dataplus._M_p;
  SVar9.Data = (char *)local_3b8._M_head_impl;
  lVar3 = llvm::Module::getFunction(SVar9);
  m._M_head_impl = local_3b8._M_head_impl;
  if (lVar3 == 0) {
    prVar5 = (raw_ostream *)llvm::errs();
    Str.Length = 0x1e;
    Str.Data = "The entry function not found: ";
    prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
    prVar5 = (raw_ostream *)
             llvm::raw_ostream::write
                       ((char *)prVar5,(ulong)local_2a0.dgOptions.entryFunction._M_dataplus._M_p);
    pcVar8 = "\n";
    sVar6 = 1;
LAB_00110acc:
    Str_00.Length = sVar6;
    Str_00.Data = pcVar8;
    llvm::raw_ostream::operator<<(prVar5,Str_00);
    goto LAB_00110ad4;
  }
  if (usepta[0x80] == '\x01') {
    paVar1 = &local_310.super_LLVMAnalysisOptions.entryFunction.field_2;
    local_310.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,
               local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus.
               _M_p,local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction.
                    _M_dataplus._M_p +
                    local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction.
                    _M_string_length);
    local_310.super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
         local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
         fieldSensitivity.offset;
    this = &local_310.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions;
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_Rb_tree(&this->_M_t,
               &local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
                allocationFunctions._M_t);
    local_310.super_PointerAnalysisOptions.preprocessGeps =
         local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.preprocessGeps;
    local_310.super_PointerAnalysisOptions.invalidateNodes =
         local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.invalidateNodes;
    local_310.super_PointerAnalysisOptions._58_6_ =
         local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions._58_6_;
    local_310.super_PointerAnalysisOptions.maxIterations =
         local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.maxIterations;
    local_310.analysisType = local_2a0.dgOptions.PTAOptions.analysisType;
    local_310.threads = local_2a0.dgOptions.PTAOptions.threads;
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              ((DGLLVMPointerAnalysis *)(local_3a8 + 8),m._M_head_impl,&local_310);
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_M_erase(&this->_M_t,
               (_Link_type)
               local_310.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions._M_t
               ._M_impl.super__Rb_tree_header._M_header._M_parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
      operator_delete(local_310.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                      local_310.super_LLVMAnalysisOptions.entryFunction.field_2.
                      _M_allocated_capacity + 1);
    }
    dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)(local_3a8 + 8));
    if (lazy[0x80] == '\x01') {
      dg::llvmdg::CallGraph::CallGraph
                ((CallGraph *)&local_3b0,local_3b8._M_head_impl,
                 (LLVMPointerAnalysis *)(local_3a8 + 8),true);
      (*((CallGraphImpl *)&(local_3b0._M_head_impl)->_vptr_CallGraphImpl)->_vptr_CallGraphImpl[6])()
      ;
      dumpCallGraph((CallGraph *)&local_3b0);
      if ((DGCallGraphImpl *)local_3b0._M_head_impl != (DGCallGraphImpl *)0x0) {
        pp_Var4 = ((CallGraphImpl *)&(local_3b0._M_head_impl)->_vptr_CallGraphImpl)->
                  _vptr_CallGraphImpl;
        this_00._M_head_impl = local_3b0._M_head_impl;
        goto LAB_00110a72;
      }
    }
    else {
      pPVar2 = *(PointerGraph **)
                ((long)local_3a0.PTA._M_t.
                       super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                       .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl + 0x38
                );
      this_00._M_head_impl = (CallGraphImpl *)operator_new(0x40);
      dg::llvmdg::DGCallGraphImpl::DGCallGraphImpl
                ((DGCallGraphImpl *)this_00._M_head_impl,&pPVar2->callGraph);
      local_3b0._M_head_impl = this_00._M_head_impl;
      dumpCallGraph((CallGraph *)&local_3b0);
      pp_Var4 = (((DGCallGraphImpl *)this_00._M_head_impl)->super_CallGraphImpl)._vptr_CallGraphImpl
      ;
LAB_00110a72:
      (*pp_Var4[1])(this_00._M_head_impl);
    }
    local_3a0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
         (_func_int **)&PTR_hasPointsTo_00120718;
    std::
    unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
    ::~unique_ptr(&local_3a0._builder);
    if (local_3a0.PTA._M_t.
        super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
        ._M_t.
        super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
        .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>)
        0x0) {
      (**(code **)(*(long *)local_3a0.PTA._M_t.
                            super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                            .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl +
                  8))();
    }
    local_3a0.PTA._M_t.
    super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
         (__uniq_ptr_data<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>,_true,_true>
          )(__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
            )0x0;
    dg::LLVMPointerAnalysis::~LLVMPointerAnalysis((LLVMPointerAnalysis *)(local_3a8 + 8));
  }
  else {
    if (lazy[0x80] == '\0') {
      prVar5 = (raw_ostream *)llvm::errs();
      pcVar8 = "Can build CG without PTA only with -lazy option\n";
      sVar6 = 0x30;
      goto LAB_00110acc;
    }
    dg::llvmdg::CallGraph::CallGraph((CallGraph *)(local_3a8 + 8),local_3b8._M_head_impl);
    (**(code **)(*local_3a0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis + 0x30))();
    dumpCallGraph((CallGraph *)(local_3a8 + 8));
    if (local_3a0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis != (_func_int **)0x0) {
      (**(code **)(*local_3a0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis + 8))();
    }
  }
  iVar7 = 0;
LAB_00110ad4:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_3b8);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_3a8);
  SlicerOptions::~SlicerOptions(&local_2a0);
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    if (usepta) {
        auto &ptaopts = options.dgOptions.PTAOptions;
#ifdef HAVE_SVF
        if (ptaopts.isSVF()) {
            SVFPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            llvmdg::CallGraph CG(M.get(), &PTA, lazy);
            dumpCallGraph(CG);
        } else
#endif // HAVE_SVF
        {
            DGLLVMPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            if (lazy) {
                llvmdg::CallGraph CG(M.get(), &PTA, lazy);
                CG.build();
                dumpCallGraph(CG);
            } else {
                // re-use the call-graph from PTA
                llvmdg::CallGraph CG(PTA.getPTA()->getPG()->getCallGraph());
                dumpCallGraph(CG);
            }
        }
    } else {
        if (!lazy) {
            llvm::errs() << "Can build CG without PTA only with -lazy option\n";
            return 1;
        }

        llvmdg::CallGraph CG(M.get());
        CG.build();
        dumpCallGraph(CG);
    }

    return 0;
}